

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QUuid *id)

{
  undefined1 *puVar1;
  qint64 qVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  long in_FS_OFFSET;
  undefined8 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  qVar2 = QDataStream::readRawData(s,(char *)&local_28,0x10);
  puVar1 = local_28;
  if (qVar2 == 0x10) {
    if (s->noswap == false) {
      uVar4 = (ushort)((ulong)local_28 >> 0x20);
      uVar5 = (ushort)((ulong)local_28 >> 0x30);
      uVar3 = (ulong)((uint)local_28 >> 0x18 | ((uint)local_28 & 0xff0000) >> 8 |
                      ((uint)local_28 & 0xff00) << 8 | (uint)local_28 << 0x18) |
              (ulong)(ushort)(uVar4 << 8 | uVar4 >> 8) << 0x20 |
              (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8) << 0x30;
      id->data1 = (int)uVar3;
      id->data2 = (short)(uVar3 >> 0x20);
      id->data3 = (short)(uVar3 >> 0x30);
      *(undefined1 **)id->data4 = puStack_20;
      local_28 = puVar1;
    }
    else {
      id->data1 = (uint)local_28;
      id->data2 = local_28._4_2_;
      id->data3 = local_28._6_2_;
      *(undefined1 **)id->data4 = puStack_20;
      local_28 = puVar1;
    }
  }
  else {
    QDataStream::setStatus(s,ReadPastEnd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QUuid &id)
{
    std::array<char, 16> bytes;
    if (s.readRawData(bytes.data(), 16) != 16) {
        s.setStatus(QDataStream::ReadPastEnd);
        return s;
    }

    if (s.byteOrder() == QDataStream::BigEndian) {
        id = QUuid::fromRfc4122(bytes);
    } else {
        const uchar *data = reinterpret_cast<const uchar *>(bytes.data());

        id.data1 = qFromLittleEndian<quint32>(data);
        data += sizeof(quint32);
        id.data2 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);
        id.data3 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            id.data4[i] = *(data);
            data++;
        }
    }

    return s;
}